

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_nnquant.c
# Opt level: O0

gdImagePtr gdImageNeuQuant(gdImagePtr im,int max_color,int sample_factor)

{
  uchar *puVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  undefined1 local_888;
  undefined1 local_884;
  undefined1 local_880;
  byte local_87c;
  uchar *p_1;
  int offset;
  int c;
  int *p;
  gdImagePtr dst;
  uchar *rgba;
  nn_quant *pnStack_848;
  int row;
  nn_quant *nnq;
  uchar *d;
  uchar map [256] [4];
  int local_430;
  int local_42c;
  int x;
  int i;
  int remap [256];
  int top_idx;
  int bot_idx;
  int verbose;
  int newcolors;
  int sample_factor_local;
  int max_color_local;
  gdImagePtr im_local;
  
  pnStack_848 = (nn_quant *)0x0;
  dst = (gdImagePtr)0x0;
  p = (int *)0x0;
  verbose = sample_factor;
  if (sample_factor < 1) {
    verbose = 3;
  }
  iVar4 = overflow2(im->sx,im->sy);
  if (((iVar4 == 0) && (iVar4 = overflow2(im->sx * im->sy,4), iVar4 == 0)) &&
     (dst = (gdImagePtr)gdMalloc((long)(im->sx * im->sy * 4)), (nn_quant *)dst != (nn_quant *)0x0))
  {
    nnq = (nn_quant *)dst;
    for (rgba._4_4_ = 0; rgba._4_4_ < im->sy; rgba._4_4_ = rgba._4_4_ + 1) {
      _offset = im->tpixels[rgba._4_4_];
      for (local_42c = 0; local_42c < im->sx; local_42c = local_42c + 1) {
        iVar4 = *_offset;
        if (im->trueColor == 0) {
          local_87c = (byte)im->alpha[iVar4];
        }
        else {
          local_87c = (byte)((uint)iVar4 >> 0x18) & 0x7f;
        }
        *(byte *)&nnq->alphadec = local_87c;
        if (im->trueColor == 0) {
          local_880 = (undefined1)im->red[iVar4];
        }
        else {
          local_880 = (undefined1)((uint)iVar4 >> 0x10);
        }
        *(undefined1 *)((long)&nnq->alphadec + 1) = local_880;
        if (im->trueColor == 0) {
          local_884 = (undefined1)im->blue[iVar4];
        }
        else {
          local_884 = (undefined1)iVar4;
        }
        piVar2 = &nnq->alphadec;
        *(undefined1 *)((long)&nnq->alphadec + 2) = local_884;
        if (im->trueColor == 0) {
          local_888 = (undefined1)im->green[iVar4];
        }
        else {
          local_888 = (undefined1)((uint)iVar4 >> 8);
        }
        nnq = (nn_quant *)&nnq->lengthcount;
        *(undefined1 *)((long)piVar2 + 3) = local_888;
        _offset = _offset + 1;
      }
    }
    pnStack_848 = (nn_quant *)gdMalloc(0x2098);
    if (pnStack_848 != (nn_quant *)0x0) {
      initnet(pnStack_848,(uchar *)dst,im->sy * im->sx * 4,verbose,max_color);
      learn(pnStack_848,1);
      unbiasnet(pnStack_848);
      getcolormap(pnStack_848,(uchar *)&d);
      inxbuild(pnStack_848);
      remap[0xfe] = max_color + -1;
      remap[0xff] = 0;
      for (local_430 = 0; iVar3 = remap[0xff], iVar4 = remap[0xfe], local_430 < max_color;
          local_430 = local_430 + 1) {
        if (map[(long)local_430 + -2][3] == 0xff) {
          remap[0xfe] = remap[0xfe] + -1;
          (&x)[local_430] = iVar4;
        }
        else {
          remap[0xff] = remap[0xff] + 1;
          (&x)[local_430] = iVar3;
        }
      }
      if (remap[0xff] == remap[0xfe] + 1) {
        p = (int *)gdImageCreate(im->sx,im->sy);
        if ((gdImagePtr)p != (gdImagePtr)0x0) {
          for (local_430 = 0; local_430 < max_color; local_430 = local_430 + 1) {
            ((gdImagePtr)p)->red[(&x)[local_430]] = (uint)map[(long)local_430 + -2][0];
            ((gdImagePtr)p)->green[(&x)[local_430]] = (uint)map[(long)local_430 + -2][1];
            ((gdImagePtr)p)->blue[(&x)[local_430]] = (uint)map[(long)local_430 + -2][2];
            ((gdImagePtr)p)->alpha[(&x)[local_430]] = (uint)map[(long)local_430 + -2][3];
            ((gdImagePtr)p)->open[(&x)[local_430]] = 0;
            ((gdImagePtr)p)->colorsTotal = ((gdImagePtr)p)->colorsTotal + 1;
          }
          for (rgba._4_4_ = 0; rgba._4_4_ < im->sy; rgba._4_4_ = rgba._4_4_ + 1) {
            puVar1 = ((gdImagePtr)p)->pixels[rgba._4_4_];
            iVar4 = rgba._4_4_ * im->sx * 4;
            for (local_42c = 0; local_42c < im->sx; local_42c = local_42c + 1) {
              uVar5 = inxsearch(pnStack_848,
                                (uint)*(byte *)((long)((nn_quant *)dst)->netindex +
                                               (long)(local_42c * 4 + iVar4) + -0x10),
                                (uint)*(byte *)((long)((nn_quant *)dst)->netindex +
                                               (long)(local_42c * 4 + iVar4 + 2) + -0x10),
                                (uint)*(byte *)((long)((nn_quant *)dst)->netindex +
                                               (long)(local_42c * 4 + iVar4 + 3) + -0x10),
                                (uint)*(byte *)((long)((nn_quant *)dst)->netindex +
                                               (long)(local_42c * 4 + iVar4 + 1) + -0x10));
              puVar1[local_42c] = (uchar)(&x)[uVar5];
            }
          }
        }
      }
      else {
        gd_error("  internal logic error: remapped bot_idx = %d, top_idx = %d\n",
                 (ulong)(uint)remap[0xff],(ulong)(uint)remap[0xfe]);
      }
    }
  }
  if (dst != (gdImagePtr)0x0) {
    gdFree(dst);
  }
  if (pnStack_848 != (nn_quant *)0x0) {
    gdFree(pnStack_848);
  }
  return (gdImagePtr)p;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageNeuQuant(gdImagePtr im, const int max_color, int sample_factor)
{
	const int newcolors = max_color;
	const int verbose = 1;

	int bot_idx, top_idx; /* for remapping of indices */
	int remap[MAXNETSIZE];
	int i,x;

	unsigned char map[MAXNETSIZE][4];
	unsigned char *d;

	nn_quant *nnq = NULL;

	int row;
	unsigned char *rgba = NULL;
	gdImagePtr dst = NULL;

	/* Default it to 3 */
	if (sample_factor < 1) {
		sample_factor = 3;
	}
	/* Start neuquant */
	/* Pierre:
	 * This implementation works with aligned contiguous buffer only
	 * Upcoming new buffers are contiguous and will be much faster.
	 * let don't bloat this code to support our good "old" 31bit format.
	 * It alos lets us convert palette image, if one likes to reduce
	 * a palette
	 */
	if (overflow2(gdImageSX(im), gdImageSY(im))
	        || overflow2(gdImageSX(im) * gdImageSY(im), 4)) {
		goto done;
	}
	rgba = (unsigned char *) gdMalloc(gdImageSX(im) * gdImageSY(im) * 4);
	if (!rgba) {
		goto done;
	}

	d = rgba;
	for (row = 0; row < gdImageSY(im); row++) {
		int *p = im->tpixels[row];
		register int c;

		for (i = 0; i < gdImageSX(im); i++) {
			c = *p;
			*d++ = gdImageAlpha(im, c);
			*d++ = gdImageRed(im, c);
			*d++ = gdImageBlue(im, c);
			*d++ = gdImageGreen(im, c);
			p++;
		}
	}

	nnq = (nn_quant *) gdMalloc(sizeof(nn_quant));
	if (!nnq) {
		goto done;
	}

	initnet(nnq, rgba, gdImageSY(im) * gdImageSX(im) * 4, sample_factor, newcolors);

	learn(nnq, verbose);
	unbiasnet(nnq);
	getcolormap(nnq, (unsigned char*)map);
	inxbuild(nnq);
	/* remapping colormap to eliminate opaque tRNS-chunk entries... */
	for (top_idx = newcolors-1, bot_idx = x = 0;  x < newcolors;  ++x) {
		if (map[x][3] == 255) { /* maxval */
			remap[x] = top_idx--;
		} else {
			remap[x] = bot_idx++;
		}
	}
	if (bot_idx != top_idx + 1) {
		gd_error("  internal logic error: remapped bot_idx = %d, top_idx = %d\n",
			 bot_idx, top_idx);
		goto done;
	}

	dst = gdImageCreate(gdImageSX(im), gdImageSY(im));
	if (!dst) {
		goto done;
	}

	for (x = 0; x < newcolors; ++x) {
		dst->red[remap[x]] = map[x][0];
		dst->green[remap[x]] = map[x][1];
		dst->blue[remap[x]] = map[x][2];
		dst->alpha[remap[x]] = map[x][3];
		dst->open[remap[x]] = 0;
		dst->colorsTotal++;
	}

	/* Do each image row */
	for ( row = 0; row < gdImageSY(im); ++row ) {
		int offset;
		unsigned char *p = dst->pixels[row];

		/* Assign the new colors */
		offset = row * gdImageSX(im) * 4;
		for(i=0; i < gdImageSX(im); i++) {
			p[i] = remap[
			           inxsearch(nnq, rgba[i * 4 + offset + ALPHA],
			                     rgba[i * 4 + offset + BLUE],
			                     rgba[i * 4 + offset + GREEN],
			                     rgba[i * 4 + offset + RED])
			       ];
		}
	}

done:
	if (rgba) {
		gdFree(rgba);
	}

	if (nnq) {
		gdFree(nnq);
	}
	return dst;
}